

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool __thiscall
Fossilize::StateRecorder::record_physical_device_features(StateRecorder *this,void *device_pnext)

{
  Impl *this_00;
  bool bVar1;
  int iVar2;
  Hash HVar3;
  mutex *__mutex;
  
  __mutex = &this->impl->record_lock;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar2 == 0) {
    this_00 = this->impl;
    bVar1 = Impl::copy_physical_device_features
                      (this_00,device_pnext,&this_00->allocator,&this_00->physical_device_features);
    if (bVar1) {
      HVar3 = Hashing::compute_hash_physical_device_features(this->impl->physical_device_features);
      (this->impl->application_feature_hash).physical_device_features_hash = HVar3;
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return bVar1;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

bool StateRecorder::record_physical_device_features(const void *device_pnext)
{
	// We just ignore pNext, but it's okay to keep it. We will not need to serialize it for now.
	std::lock_guard<std::mutex> lock(impl->record_lock);
	if (!impl->copy_physical_device_features(device_pnext, impl->allocator, &impl->physical_device_features))
		return false;
	impl->application_feature_hash.physical_device_features_hash =
			Hashing::compute_hash_physical_device_features(impl->physical_device_features);
	return true;
}